

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O1

void __thiscall QTlsPrivate::TlsCryptographOpenSSL::disconnected(TlsCryptographOpenSSL *this)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)QSslSocketPrivate::plainTcpSocket();
  QSslSocketPrivate::setEncrypted(SUB81(this->d,0));
  lVar2 = (**(code **)(*plVar1 + 0xa0))(plVar1);
  if (0 < lVar2) {
    QSslSocketPrivate::maxReadBufferSize();
    QSslSocketPrivate::setMaxReadBufferSize((longlong)this->d);
    (**(code **)(*(long *)this + 200))(this);
    QSslSocketPrivate::setMaxReadBufferSize((longlong)this->d);
    return;
  }
  destroySslContext(this);
  return;
}

Assistant:

void TlsCryptographOpenSSL::disconnected()
{
    Q_ASSERT(d);
    auto *plainSocket = d->plainTcpSocket();
    Q_ASSERT(plainSocket);
    d->setEncrypted(false);

    if (plainSocket->bytesAvailable() <= 0) {
        destroySslContext();
    } else {
        // Move all bytes into the plain buffer.
        const qint64 tmpReadBufferMaxSize = d->maxReadBufferSize();
        // Reset temporarily, so the plain socket buffer is completely drained:
        d->setMaxReadBufferSize(0);
        transmit();
        d->setMaxReadBufferSize(tmpReadBufferMaxSize);
    }
    //if there is still buffered data in the plain socket, don't destroy the ssl context yet.
    //it will be destroyed when the socket is deleted.
}